

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall
TArray<FSpecialAction,_FSpecialAction>::Reserve
          (TArray<FSpecialAction,_FSpecialAction> *this,uint amount)

{
  uint uVar1;
  long lVar2;
  FSpecialAction *pFVar3;
  uint uVar4;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar4 = amount + uVar1;
  this->Count = uVar4;
  if (uVar1 < uVar4) {
    pFVar3 = this->Array + uVar1;
    lVar2 = (ulong)uVar4 - (ulong)uVar1;
    do {
      (pFVar3->Type).Index = 0;
      pFVar3 = pFVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}